

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::writePad(QPDFWriter *this,size_t nspaces)

{
  string_view str;
  char *local_30;
  size_t local_28;
  char local_20 [16];
  
  local_30 = local_20;
  std::__cxx11::string::_M_construct((ulong)&local_30,(char)nspaces);
  str._M_str = local_30;
  str._M_len = local_28;
  writeString(this,str);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void
QPDFWriter::writePad(size_t nspaces)
{
    writeString(std::string(nspaces, ' '));
}